

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Activation.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeActivation(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *this;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *layerType;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  reference __x;
  ReLUParameter *this_00;
  ELUParameter *this_01;
  ActivationELU *this_02;
  BlobProto *pBVar5;
  WeightParams *this_03;
  RepeatedField<float> *other;
  float extraout_XMM0_Da;
  float fVar6;
  NetParameter *in_stack_00000008;
  float local_1c4;
  RepeatedField<float> *local_1c0;
  RepeatedField<float> *alpha;
  int C;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  ActivationPReLU *local_118;
  ActivationPReLU *prelu;
  PReLUParameter *caffeLayerParams_2;
  LayerParameter *caffeLayerWeights;
  ELUParameter *pEStack_f8;
  int layerIdWeights;
  ELUParameter *caffeLayerParams_1;
  ActivationLeakyReLU *leakyRelu;
  ReLUParameter *caffeLayerParams;
  ActivationParams *specLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_51;
  string local_50;
  NeuralNetworkLayer *local_30;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_30 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar2 = caffe::LayerParameter::bottom_size((LayerParameter *)mappingDataBlobNames);
  if ((iVar2 != 1) ||
     (iVar2 = caffe::LayerParameter::top_size((LayerParameter *)mappingDataBlobNames), iVar2 != 1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
    psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    layerType = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_50,psVar3,layerType);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar4 = caffe::LayerParameter::bottom_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar4);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar4);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1,(iterator *)&bottomName), bVar1) {
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar4 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar4);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar4);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1_1,(iterator *)&topName), bVar1) {
    specLayerParams =
         (ActivationParams *)
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)specLayerParams);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar3 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  convertCaffeMetadata
            (psVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  caffeLayerParams =
       (ReLUParameter *)CoreML::Specification::NeuralNetworkLayer::mutable_activation(local_30);
  psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  bVar1 = std::operator==(psVar3,"ReLU");
  if (bVar1) {
    this_00 = caffe::LayerParameter::relu_param((LayerParameter *)mappingDataBlobNames);
    leakyRelu = (ActivationLeakyReLU *)this_00;
    caffe::ReLUParameter::negative_slope(this_00);
    std::abs((int)this_00);
    if (1e-06 <= extraout_XMM0_Da) {
      this_01 = (ELUParameter *)
                CoreML::Specification::ActivationParams::mutable_leakyrelu
                          ((ActivationParams *)caffeLayerParams);
      caffeLayerParams_1 = this_01;
      fVar6 = caffe::ReLUParameter::negative_slope((ReLUParameter *)leakyRelu);
      CoreML::Specification::ActivationLeakyReLU::set_alpha((ActivationLeakyReLU *)this_01,fVar6);
    }
    else {
      CoreML::Specification::ActivationParams::mutable_relu((ActivationParams *)caffeLayerParams);
    }
  }
  else {
    psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    bVar1 = std::operator==(psVar3,"TanH");
    if (bVar1) {
      CoreML::Specification::ActivationParams::mutable_tanh((ActivationParams *)caffeLayerParams);
    }
    else {
      psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
      bVar1 = std::operator==(psVar3,"Sigmoid");
      if (bVar1) {
        CoreML::Specification::ActivationParams::mutable_sigmoid
                  ((ActivationParams *)caffeLayerParams);
      }
      else {
        psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
        bVar1 = std::operator==(psVar3,"ELU");
        if (bVar1) {
          pEStack_f8 = caffe::LayerParameter::elu_param((LayerParameter *)mappingDataBlobNames);
          this_02 = CoreML::Specification::ActivationParams::mutable_elu
                              ((ActivationParams *)caffeLayerParams);
          fVar6 = caffe::ELUParameter::alpha(pEStack_f8);
          CoreML::Specification::ActivationELU::set_alpha(this_02,fVar6);
        }
        else {
          psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
          bVar1 = std::operator==(psVar3,"BNLL");
          if (bVar1) {
            CoreML::Specification::ActivationParams::mutable_softplus
                      ((ActivationParams *)caffeLayerParams);
          }
          else {
            psVar3 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
            bVar1 = std::operator==(psVar3,"PReLU");
            if (bVar1) {
              caffeLayerWeights._4_4_ =
                   getLayerIndex((LayerParameter *)mappingDataBlobNames,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)layerParameters.mappingDataBlobNames);
              caffeLayerParams_2 =
                   (PReLUParameter *)
                   caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
              prelu = (ActivationPReLU *)
                      caffe::LayerParameter::prelu_param((LayerParameter *)mappingDataBlobNames);
              local_118 = CoreML::Specification::ActivationParams::mutable_prelu
                                    ((ActivationParams *)caffeLayerParams);
              iVar2 = caffe::LayerParameter::blobs_size((LayerParameter *)caffeLayerParams_2);
              if (iVar2 == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_138,"Parameters (alpha values) not found",&local_139);
                psVar3 = caffe::LayerParameter::name_abi_cxx11_
                                   ((LayerParameter *)mappingDataBlobNames);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_160,"PReLU",&local_161);
                errorInCaffeProto(&local_138,psVar3,&local_160);
                std::__cxx11::string::~string((string *)&local_160);
                std::allocator<char>::~allocator((allocator<char> *)&local_161);
                std::__cxx11::string::~string((string *)&local_138);
                std::allocator<char>::~allocator((allocator<char> *)&local_139);
              }
              bVar1 = caffe::PReLUParameter::channel_shared((PReLUParameter *)prelu);
              if (bVar1) {
                pBVar5 = caffe::LayerParameter::blobs((LayerParameter *)caffeLayerParams_2,0);
                iVar2 = caffe::BlobProto::data_size(pBVar5);
                if (iVar2 != 1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_188,
                             "Expected a scalar parameter (alpha) when \'channel_shared\' flag is set"
                             ,&local_189);
                  psVar3 = caffe::LayerParameter::name_abi_cxx11_
                                     ((LayerParameter *)mappingDataBlobNames);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&C,"PReLU",(allocator *)((long)&alpha + 7))
                  ;
                  errorInCaffeProto(&local_188,psVar3,(string *)&C);
                  std::__cxx11::string::~string((string *)&C);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&alpha + 7));
                  std::__cxx11::string::~string((string *)&local_188);
                  std::allocator<char>::~allocator((allocator<char> *)&local_189);
                }
              }
              pBVar5 = caffe::LayerParameter::blobs((LayerParameter *)caffeLayerParams_2,0);
              alpha._0_4_ = caffe::BlobProto::data_size(pBVar5);
              this_03 = CoreML::Specification::ActivationPReLU::mutable_alpha(local_118);
              local_1c0 = CoreML::Specification::WeightParams::mutable_floatvalue(this_03);
              local_1c4 = 0.0;
              google::protobuf::RepeatedField<float>::Resize(local_1c0,(int)alpha,&local_1c4);
              this = local_1c0;
              pBVar5 = caffe::LayerParameter::blobs((LayerParameter *)caffeLayerParams_2,0);
              other = caffe::BlobProto::data(pBVar5);
              google::protobuf::RepeatedField<float>::CopyFrom(this,other);
            }
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeActivation(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::ActivationParams* specLayerParams = specLayer->mutable_activation();
    
    if (caffeLayer.type() == "ReLU"){
        const caffe::ReLUParameter& caffeLayerParams = caffeLayer.relu_param();
        if (std::abs(caffeLayerParams.negative_slope()) < 1e-6f) {
            (void) specLayerParams->mutable_relu();
        } else {
            auto* leakyRelu = specLayerParams->mutable_leakyrelu();
            leakyRelu->set_alpha(caffeLayerParams.negative_slope());
        }
    } else if (caffeLayer.type() == "TanH"){
        (void) specLayerParams->mutable_tanh();
    } else if (caffeLayer.type() == "Sigmoid"){
        (void) specLayerParams->mutable_sigmoid();
    } else if (caffeLayer.type() == "ELU") {
        const caffe::ELUParameter& caffeLayerParams = caffeLayer.elu_param();
        specLayerParams->mutable_elu()->set_alpha(caffeLayerParams.alpha());
    } else if (caffeLayer.type() == "BNLL") {
        (void) specLayerParams->mutable_softplus();
    } else if (caffeLayer.type() == "PReLU") {
        int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
        const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
        const caffe::PReLUParameter& caffeLayerParams = caffeLayer.prelu_param();
        auto* prelu = specLayerParams->mutable_prelu();
        //***************** Some Error Checking in Caffe Proto **********
        if (caffeLayerWeights.blobs_size() == 0){
            CoreMLConverter::errorInCaffeProto("Parameters (alpha values) not found", caffeLayer.name(), "PReLU");
        }
        if (caffeLayerParams.channel_shared()) {
            if (caffeLayerWeights.blobs(0).data_size() != 1){
                CoreMLConverter::errorInCaffeProto("Expected a scalar parameter (alpha) when 'channel_shared' flag is set", caffeLayer.name(), "PReLU");
            }
        }
        //***************************************************************
        int C = caffeLayerWeights.blobs(0).data_size();
        ::google::protobuf::RepeatedField<float>* alpha = prelu->mutable_alpha()->mutable_floatvalue();
        alpha->Resize(C, 0.0);
        alpha->CopyFrom(caffeLayerWeights.blobs(0).data());
    }
    
}